

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QUtil::read_lines_from_file_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QUtil *this,istream *in,bool preserve_eol)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<bool_(char_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:1249:22)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(char_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:1249:22)>
             ::_M_manager;
  local_30._M_unused._0_8_ = (undefined8)this;
  read_lines_from_file((function<bool_(char_&)> *)&local_30,__return_storage_ptr__,SUB81(in,0));
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string>
QUtil::read_lines_from_file(std::istream& in, bool preserve_eol)
{
    std::list<std::string> lines;
    auto next_char = [&in](char& ch) { return (in.get(ch)) ? true : false; };
    read_lines_from_file(next_char, lines, preserve_eol);
    return lines;
}